

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UnlinkAndDeleteTrigger(sqlite3 *db,int iDb,char *zName)

{
  Trigger *pTrigger_00;
  Table *pTVar1;
  Trigger **local_40;
  Trigger **pp;
  Table *pTab;
  Hash *pHash;
  Trigger *pTrigger;
  char *zName_local;
  int iDb_local;
  sqlite3 *db_local;
  
  pTrigger_00 = (Trigger *)sqlite3HashInsert(&(db->aDb[iDb].pSchema)->trigHash,zName,(void *)0x0);
  if (pTrigger_00 != (Trigger *)0x0) {
    if (pTrigger_00->pSchema == pTrigger_00->pTabSchema) {
      pTVar1 = tableOfTrigger(pTrigger_00);
      for (local_40 = &pTVar1->pTrigger; *local_40 != pTrigger_00; local_40 = &(*local_40)->pNext) {
      }
      *local_40 = (*local_40)->pNext;
    }
    sqlite3DeleteTrigger(db,pTrigger_00);
    db->mDbFlags = db->mDbFlags | 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UnlinkAndDeleteTrigger(sqlite3 *db, int iDb, const char *zName){
  Trigger *pTrigger;
  Hash *pHash;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pHash = &(db->aDb[iDb].pSchema->trigHash);
  pTrigger = sqlite3HashInsert(pHash, zName, 0);
  if( ALWAYS(pTrigger) ){
    if( pTrigger->pSchema==pTrigger->pTabSchema ){
      Table *pTab = tableOfTrigger(pTrigger);
      Trigger **pp;
      for(pp=&pTab->pTrigger; *pp!=pTrigger; pp=&((*pp)->pNext));
      *pp = (*pp)->pNext;
    }
    sqlite3DeleteTrigger(db, pTrigger);
    db->mDbFlags |= DBFLAG_SchemaChange;
  }
}